

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  lzx_stream *strm;
  undefined1 *puVar1;
  z_streamp strm_00;
  undefined1 uVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  undefined4 uVar8;
  bool bVar9;
  uint uVar10;
  ssize_t sVar11;
  ushort uVar12;
  wchar_t wVar13;
  uint uVar14;
  uint uVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  char *pcVar22;
  ulong uVar23;
  int64_t iVar24;
  byte *pbVar25;
  undefined4 *puVar26;
  void *pvVar27;
  undefined4 uVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  byte bVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  undefined1 *__dest;
  undefined1 *puVar38;
  uint uVar39;
  void *pvVar40;
  uint uVar41;
  wchar_t wVar42;
  size_t __n;
  char cVar43;
  uint local_194;
  uint local_184;
  uint local_180;
  uint local_16c;
  uint local_15c;
  ulong local_130;
  ssize_t bytes_avail;
  ssize_t sStack_f0;
  long local_b0;
  undefined4 *local_a8;
  long local_a0;
  long local_98;
  int local_8c;
  long local_88;
  huffman *local_80;
  long local_78;
  long local_70;
  huffman *local_68;
  ssize_t *local_60;
  long local_58;
  huffman *local_50;
  byte *local_48;
  ssize_t bytes_avail_1;
  long local_38;
  
  pvVar20 = a->format->data;
  wVar13 = cab_next_cfdata(a);
  if (wVar13 < L'\0') {
    *avail = (long)wVar13;
    return (void *)0x0;
  }
  lVar36 = *(long *)((long)pvVar20 + 0x28);
  sVar3 = *(short *)(lVar36 + 6);
  if (sVar3 == 3) {
    pvVar20 = a->format->data;
    lVar36 = *(long *)((long)pvVar20 + 0x38);
    pvVar21 = *(void **)((long)pvVar20 + 0xa0);
    if (pvVar21 == (void *)0x0) {
      *(undefined8 *)((long)pvVar20 + 0xa8) = 0x8000;
      pvVar21 = malloc(0x8000);
      *(void **)((long)pvVar20 + 0xa0) = pvVar21;
      if (pvVar21 == (void *)0x0) {
        pcVar22 = "No memory for CAB reader";
        iVar19 = 0xc;
        goto LAB_003d654a;
      }
    }
    uVar23 = (ulong)*(ushort *)(lVar36 + 0xc);
    if (*(ushort *)(lVar36 + 0xc) == *(ushort *)(lVar36 + 8)) {
      uVar12 = *(ushort *)(lVar36 + 0xe);
      *avail = uVar23 - uVar12;
      return (void *)((long)pvVar21 + (ulong)uVar12);
    }
    if (*(char *)(*(long *)((long)pvVar20 + 0x28) + 0x5c) == '\0') {
      uVar12 = *(ushort *)(*(long *)((long)pvVar20 + 0x28) + 8);
      puVar26 = *(undefined4 **)((long)pvVar20 + 0x1b8);
      if (puVar26 == (undefined4 *)0x0) {
        puVar26 = (undefined4 *)calloc(1,0x260);
        *(undefined4 **)((long)pvVar20 + 0x1b8) = puVar26;
        if (puVar26 != (undefined4 *)0x0) goto LAB_003d6102;
      }
      else {
LAB_003d6102:
        puVar26[0x97] = 0xffffffe7;
        if (0xfffffff8 < uVar12 - 0x16) {
          puVar26[0x97] = 0xffffffe2;
          iVar19 = puVar26[1];
          uVar41 = slots[uVar12 - 0xf];
          iVar34 = 1 << ((byte)uVar12 & 0x1f);
          puVar26[1] = iVar34;
          puVar26[2] = iVar34 + -1;
          if ((*(void **)(puVar26 + 4) == (void *)0x0) || (iVar19 != iVar34)) {
            free(*(void **)(puVar26 + 4));
            pvVar21 = malloc((long)(int)puVar26[1]);
            *(void **)(puVar26 + 4) = pvVar21;
            if (pvVar21 != (void *)0x0) {
              free(*(void **)(puVar26 + 0x18));
              pvVar21 = malloc((long)(int)uVar41 * 8);
              *(void **)(puVar26 + 0x18) = pvVar21;
              if (pvVar21 != (void *)0x0) {
                lzx_huffman_free((huffman *)(puVar26 + 0x5a));
                goto LAB_003d61a9;
              }
            }
          }
          else {
LAB_003d61a9:
            for (lVar31 = 0; lVar31 != 0x12; lVar31 = lVar31 + 1) {
              *(int *)((long)&bytes_avail + lVar31 * 4) = 1 << ((byte)lVar31 & 0x1f);
            }
            uVar32 = 0;
            if (0 < (int)uVar41) {
              uVar32 = (ulong)uVar41;
            }
            iVar19 = 0;
            uVar14 = 0;
            for (uVar37 = 0; uVar37 != uVar32; uVar37 = uVar37 + 1) {
              if (uVar14 == 0) {
                iVar19 = (int)uVar37;
LAB_003d6480:
                uVar14 = 0xfffffffe;
                for (iVar34 = iVar19; iVar34 != 0; iVar34 = iVar34 >> 1) {
                  uVar14 = uVar14 + 1;
                }
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
              }
              else {
                iVar19 = iVar19 + *(int *)((long)&bytes_avail + (ulong)uVar14 * 4);
                if (uVar14 < 0x11) goto LAB_003d6480;
              }
              lVar31 = *(long *)(puVar26 + 0x18);
              *(int *)(lVar31 + uVar37 * 8) = iVar19;
              *(uint *)(lVar31 + 4 + uVar37 * 8) = uVar14;
            }
            puVar26[6] = 0;
            *puVar26 = 0;
            *(undefined8 *)(puVar26 + 0x1a) = 0;
            puVar26[0x1c] = 0;
            puVar26[0x12] = 1;
            *(undefined8 *)(puVar26 + 0x10) = 0x100000001;
            wVar13 = lzx_huffman_init((huffman *)(puVar26 + 0x1e),8,L'\b');
            if ((((wVar13 == L'\0') &&
                 (wVar13 = lzx_huffman_init((huffman *)(puVar26 + 0x78),0x14,L'\n'), wVar13 == L'\0'
                 )) && (wVar13 = lzx_huffman_init((huffman *)(puVar26 + 0x5a),
                                                  (long)(int)(uVar41 * 8 + 0x100),L'\x10'),
                       wVar13 == L'\0')) &&
               (wVar13 = lzx_huffman_init((huffman *)(puVar26 + 0x3c),0xf9,L'\x10'), wVar13 == L'\0'
               )) {
              puVar26[0x97] = 0;
              *(undefined1 *)(*(long *)((long)pvVar20 + 0x28) + 0x5c) = 1;
              goto LAB_003d4e88;
            }
          }
        }
      }
      pcVar22 = "Can\'t initialize LZX decompression.";
      iVar19 = -1;
LAB_003d654a:
      archive_set_error(&a->archive,iVar19,pcVar22);
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_003d4e88:
    lVar31 = *(long *)((long)pvVar20 + 0x1b8);
    *(undefined4 *)(lVar31 + 0x70) = 0;
    strm = (lzx_stream *)((long)pvVar20 + 0x188);
    *(undefined1 *)(lVar31 + 0x75) = 0;
    *(ulong *)((long)pvVar20 + 0x1b0) = uVar23;
    local_98 = lVar36;
LAB_003d4eb2:
    uVar12 = *(ushort *)(lVar36 + 8);
    lVar31 = uVar12 - uVar23;
    if (lVar31 != 0 && (long)uVar23 <= (long)(ulong)uVar12) {
      *(ulong *)((long)pvVar20 + 0x1a0) = uVar23 + *(long *)((long)pvVar20 + 0xa0);
      *(long *)((long)pvVar20 + 0x1a8) = lVar31;
      pbVar25 = (byte *)__archive_read_ahead(a,1,&bytes_avail_1);
      if (0 < bytes_avail_1) {
        uVar23 = (ulong)*(ushort *)(lVar36 + 6);
        if (uVar23 < (ulong)bytes_avail_1) {
          bytes_avail_1 = uVar23;
        }
        sVar11 = bytes_avail_1;
        *(byte **)((long)pvVar20 + 0x188) = pbVar25;
        *(ssize_t *)((long)pvVar20 + 400) = bytes_avail_1;
        *(undefined8 *)((long)pvVar20 + 0x198) = 0;
        piVar6 = *(int **)((long)pvVar20 + 0x1b8);
        uVar41 = piVar6[0x97];
        if (uVar41 == 0) {
          local_48 = pbVar25;
          if (((bytes_avail_1 != 0) && (*(char *)((long)piVar6 + 0x75) != '\0')) &&
             (iVar19 = piVar6[0x1c], iVar19 + -0x41 < -0x10)) {
            *(ulong *)(piVar6 + 0x1a) =
                 (ulong)*(byte *)(piVar6 + 0x1d) |
                 (ulong)*pbVar25 << 8 | *(long *)(piVar6 + 0x1a) << 0x10;
            *(byte **)((long)pvVar20 + 0x188) = pbVar25 + 1;
            *(ssize_t *)((long)pvVar20 + 400) = bytes_avail_1 + -1;
            piVar6[0x1c] = iVar19 + 0x10;
            *(undefined1 *)((long)piVar6 + 0x75) = 0;
          }
LAB_003d4fb0:
          if (*piVar6 < 0x12) {
            piVar7 = *(int **)((long)pvVar20 + 0x1b8);
            br = (lzx_br *)(piVar7 + 0x1a);
            iVar19 = *piVar7;
switchD_003d4fde_default:
            switch(iVar19) {
            case 0:
              iVar19 = piVar7[0x1c];
              if (iVar19 < 1) {
                wVar13 = lzx_br_fillup(strm,br);
                iVar19 = piVar7[0x1c];
                if (iVar19 < 1 && wVar13 == L'\0') {
                  *piVar7 = 0;
                  goto LAB_003d5f7e;
                }
              }
              uVar41 = iVar19 - 1;
              cVar43 = (*(ulong *)(piVar7 + 0x1a) >> ((ulong)uVar41 & 0x3f) & 1) != 0;
              *(char *)(piVar7 + 10) = cVar43;
              piVar7[0x1c] = uVar41;
              break;
            case 1:
              cVar43 = (char)piVar7[10];
              uVar41 = piVar7[0x1c];
              break;
            case 2:
              uVar41 = piVar7[0x1c];
              goto LAB_003d5079;
            case 3:
              iVar19 = piVar7[0x1c];
              goto LAB_003d50c5;
            case 4:
              uVar41 = piVar7[0x1c];
              goto LAB_003d5313;
            case 5:
            case 6:
            case 7:
              goto switchD_003d4fde_caseD_5;
            case 8:
              goto switchD_003d4fde_caseD_8;
            case 9:
              goto switchD_003d4fde_caseD_9;
            case 10:
              goto switchD_003d4fde_caseD_a;
            case 0xb:
              goto switchD_003d4fde_caseD_b;
            case 0xc:
              goto switchD_003d4fde_caseD_c;
            case 0xd:
              goto switchD_003d4fde_caseD_d;
            case 0xe:
              goto switchD_003d4fde_caseD_e;
            case 0xf:
              goto switchD_003d4fde_caseD_f;
            case 0x10:
              goto switchD_003d4fde_caseD_10;
            case 0x11:
              goto switchD_003d4fde_caseD_11;
            default:
              goto switchD_003d4fde_default;
            }
            if (cVar43 != '\0') {
              if ((int)uVar41 < 0x20) {
                wVar13 = lzx_br_fillup(strm,br);
                uVar41 = piVar7[0x1c];
                if ((int)uVar41 < 0x20 && wVar13 == L'\0') {
                  *piVar7 = 1;
                  goto LAB_003d5f7e;
                }
              }
              cVar43 = (char)uVar41;
              uVar41 = uVar41 - 0x20;
              piVar7[9] = (uint)(*(ulong *)(piVar7 + 0x1a) >> ((byte)uVar41 & 0x3f)) & 0xffff |
                          (int)(*(ulong *)(piVar7 + 0x1a) >> (cVar43 - 0x10U & 0x3f)) << 0x10;
              piVar7[0x1c] = uVar41;
            }
LAB_003d5079:
            if ((int)uVar41 < 3) {
              wVar13 = lzx_br_fillup(strm,br);
              uVar41 = piVar7[0x1c];
              if ((int)uVar41 < 3 && wVar13 == L'\0') {
                *piVar7 = 2;
                goto LAB_003d5f7e;
              }
            }
            iVar19 = uVar41 - 3;
            bVar33 = (byte)(*(ulong *)(piVar7 + 0x1a) >> ((byte)iVar19 & 0x3f)) & 7;
            *(byte *)((long)piVar7 + 0x29) = bVar33;
            piVar7[0x1c] = iVar19;
            if (2 < (byte)(bVar33 - 1)) goto LAB_003d5f85;
LAB_003d50c5:
            if (iVar19 < 0x18) {
              wVar13 = lzx_br_fillup(strm,br);
              iVar19 = piVar7[0x1c];
              if (iVar19 < 0x18 && wVar13 == L'\0') {
                *piVar7 = 3;
                goto LAB_003d5f7e;
              }
            }
            uVar41 = iVar19 - 0x18;
            uVar32 = *(ulong *)(piVar7 + 0x1a) >> ((byte)uVar41 & 0x3f) & 0xffff |
                     (ulong)(((uint)(*(ulong *)(piVar7 + 0x1a) >> ((char)iVar19 - 8U & 0x3f)) & 0xff
                             ) << 0x10);
            *(ulong *)(piVar7 + 0xc) = uVar32;
            piVar7[0x1c] = uVar41;
            if (uVar32 == 0) goto LAB_003d5f85;
            *(ulong *)(piVar7 + 0xe) = uVar32;
            iVar19 = 0xb;
            if (*(char *)((long)piVar7 + 0x29) != '\x01') {
              if (*(char *)((long)piVar7 + 0x29) == '\x03') {
LAB_003d5313:
                if ((uVar41 & 0xf) == 0) {
                  if ((int)uVar41 < 0x10) {
                    wVar13 = lzx_br_fillup(strm,br);
                    uVar41 = piVar7[0x1c];
                    if ((int)uVar41 < 0x10 && wVar13 == L'\0') {
                      *piVar7 = 4;
                      goto LAB_003d5f7e;
                    }
                  }
                  uVar41 = uVar41 - 0x10;
                }
                else {
                  uVar41 = uVar41 & 0xfffffff0;
                }
                piVar7[0x1c] = uVar41;
                piVar7[0x14] = 0;
                *piVar7 = 5;
                goto switchD_003d4fde_caseD_5;
              }
              iVar19 = 10;
            }
            *piVar7 = iVar19;
            goto switchD_003d4fde_default;
          }
          local_38 = *(long *)((long)pvVar20 + 0x1a8);
          local_a8 = *(undefined4 **)((long)pvVar20 + 0x1b8);
          local_60 = (ssize_t *)(local_a8 + 0x1a);
          bytes_avail = *(ssize_t *)(local_a8 + 0x1a);
          sStack_f0 = *(ssize_t *)(local_a8 + 0x1c);
          local_80 = (huffman *)(local_a8 + 0x1e);
          local_68 = (huffman *)(local_a8 + 0x3c);
          local_50 = (huffman *)(local_a8 + 0x5a);
          local_78 = *(long *)(local_a8 + 0x18);
          puVar1 = *(undefined1 **)((long)pvVar20 + 0x1a0) + local_38;
          lVar31 = *(long *)(local_a8 + 4);
          local_88 = *(long *)(local_a8 + 0x30);
          local_70 = *(long *)(local_a8 + 0x4e);
          local_58 = *(long *)(local_a8 + 0x6c);
          local_130 = *(ulong *)(local_a8 + 0xe);
          local_b0 = (long)(int)local_a8[0x32];
          cVar43 = *(char *)((long)local_a8 + 0x29);
          local_a0 = (long)(int)local_a8[0x50];
          wVar13 = local_a8[0x6e];
          local_180 = local_a8[8];
          uVar14 = local_a8[6];
          uVar4 = local_a8[2];
          local_8c = local_a8[1];
          uVar15 = local_a8[0x15];
          wVar16 = local_a8[0x17];
          local_184 = local_a8[0x16];
          local_194 = local_a8[0x10];
          __dest = *(undefined1 **)((long)pvVar20 + 0x1a0);
          uVar41 = local_a8[7];
          uVar8 = *local_a8;
          uVar29 = local_a8[0x12];
          uVar10 = local_a8[0x11];
switchD_003d549b_default:
          do {
            local_16c = uVar10;
            local_15c = uVar29;
            uVar28 = uVar8;
            uVar39 = uVar41;
            uVar41 = uVar39;
            uVar8 = uVar28;
            uVar29 = local_15c;
            uVar10 = local_16c;
            puVar38 = __dest;
            switch(uVar28) {
            case 0x12:
              lVar35 = 0;
              do {
                if (local_130 - lVar35 == 0) {
                  *local_a8 = 2;
                  *local_60 = bytes_avail;
                  local_60[1] = sStack_f0;
                  *(undefined8 *)(local_a8 + 0xe) = 0;
                  local_a8[8] = local_180;
                  local_a8[7] = uVar39;
                  local_a8[0x15] = uVar15;
                  local_a8[0x16] = local_184;
                  local_a8[0x10] = local_194;
                  local_a8[0x11] = local_16c;
                  local_a8[0x12] = local_15c;
                  local_a8[6] = uVar14;
                  *(undefined1 **)((long)pvVar20 + 0x1a8) = puVar1 + (-lVar35 - (long)__dest);
                  uVar41 = 1;
                  goto LAB_003d6036;
                }
                puVar38 = __dest + lVar35;
                if (puVar1 <= puVar38) {
LAB_003d5deb:
                  uVar28 = 0x12;
                  local_130 = local_130 - lVar35;
                  goto LAB_003d5e03;
                }
                wVar42 = (wchar_t)sStack_f0;
                if ((wchar_t)sStack_f0 < wVar13) {
                  wVar17 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
                  wVar42 = (wchar_t)sStack_f0;
                  if ((wVar17 != L'\0') || (wVar13 <= (wchar_t)sStack_f0)) goto LAB_003d5579;
                  if (sVar11 != uVar23) goto LAB_003d5deb;
                  wVar17 = lzx_decode_huffman(local_50,(uint)(bytes_avail <<
                                                             ((char)wVar13 - (char)sStack_f0 & 0x3fU
                                                             )) & cache_masks[wVar13]);
                  iVar19 = wVar42 - (uint)*(byte *)(local_58 + (ulong)(uint)wVar17);
                  sStack_f0 = CONCAT44(sStack_f0._4_4_,iVar19);
                  if (iVar19 < 0) goto LAB_003d6021;
                }
                else {
LAB_003d5579:
                  wVar17 = lzx_decode_huffman(local_50,(uint)((ulong)bytes_avail >>
                                                             ((char)wVar42 - (char)wVar13 & 0x3fU))
                                                       & cache_masks[wVar13]);
                  sStack_f0 = CONCAT44(sStack_f0._4_4_,
                                       wVar42 - (uint)*(byte *)(local_58 + (ulong)(uint)wVar17));
                }
                if (0xff < (uint)wVar17) goto LAB_003d5609;
                *(char *)(lVar31 + (int)uVar14) = (char)wVar17;
                uVar14 = uVar14 + 1 & uVar4;
                *puVar38 = (char)wVar17;
                lVar35 = lVar35 + 1;
              } while( true );
            case 0x13:
              goto LAB_003d5621;
            case 0x14:
              goto LAB_003d57bb;
            case 0x15:
              uVar41 = local_194;
              goto LAB_003d5a32;
            case 0x16:
              goto LAB_003d5a45;
            }
          } while( true );
        }
        iVar24 = 0;
        goto LAB_003d5fb8;
      }
      archive_set_error(&a->archive,0x54,"Truncated CAB file data");
      goto LAB_003d6329;
    }
    if ((ulong)*(ushort *)(lVar36 + 6) != 0) {
      pvVar21 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar36 + 6),&bytes_avail);
      if (bytes_avail < 1) {
        truncated_error(a);
      }
      else {
        *(ulong *)(lVar36 + 0x10) = (ulong)*(ushort *)(lVar36 + 6);
        *(void **)(lVar36 + 0x38) = pvVar21;
        iVar24 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar36 + 6));
        if (-1 < iVar24) {
          uVar12 = *(ushort *)(lVar36 + 8);
          goto LAB_003d6275;
        }
      }
LAB_003d6329:
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_003d6275:
    pvVar21 = *(void **)((long)pvVar20 + 0xa0);
    if ((10 < uVar12) &&
       (lVar31 = *(long *)((long)pvVar20 + 0x1b8), lVar36 = local_98,
       *(char *)(lVar31 + 0x28) != '\0')) {
      iVar19 = *(int *)(*(long *)((long)pvVar20 + 0x28) + 0x58);
      pvVar40 = (void *)((long)pvVar21 + ((ulong)uVar12 - 10));
      pvVar27 = pvVar21;
      while ((pvVar27 < pvVar40 &&
             (pvVar27 = memchr(pvVar27,0xe8,(long)pvVar40 - (long)pvVar27), pvVar27 != (void *)0x0))
            ) {
        iVar30 = ((int)pvVar21 - (int)pvVar27) + iVar19 * -0x8000 + 0x8000;
        iVar34 = *(int *)((long)pvVar27 + 1);
        if ((iVar30 <= iVar34) && (iVar5 = *(int *)(lVar31 + 0x24), iVar34 < iVar5)) {
          if (iVar34 < 0) {
            iVar30 = iVar5;
          }
          *(int *)((long)pvVar27 + 1) = iVar30 + iVar34;
        }
        pvVar27 = (void *)((long)pvVar27 + 5);
      }
      pvVar21 = *(void **)((long)pvVar20 + 0xa0);
      lVar36 = local_98;
    }
    uVar12 = *(ushort *)(lVar36 + 0xe);
    *avail = (uVar23 & 0xffff) - (ulong)uVar12;
    *(short *)(lVar36 + 0xc) = (short)uVar23;
    return (void *)((long)pvVar21 + (ulong)uVar12);
  }
  if (sVar3 == 1) {
    pvVar20 = a->format->data;
    lVar36 = *(long *)((long)pvVar20 + 0x38);
    pvVar21 = *(void **)((long)pvVar20 + 0xa0);
    if (pvVar21 == (void *)0x0) {
      *(undefined8 *)((long)pvVar20 + 0xa8) = 0x8000;
      pvVar21 = malloc(0x8000);
      *(void **)((long)pvVar20 + 0xa0) = pvVar21;
      if (pvVar21 != (void *)0x0) goto LAB_003d4c08;
      pcVar22 = "No memory for CAB reader";
      iVar19 = 0xc;
LAB_003d6415:
      archive_set_error(&a->archive,iVar19,pcVar22);
LAB_003d641c:
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_003d4c08:
    uVar23 = (ulong)*(ushort *)(lVar36 + 0xc);
    if (*(ushort *)(lVar36 + 0xc) == *(ushort *)(lVar36 + 8)) {
      uVar12 = *(ushort *)(lVar36 + 0xe);
      *avail = uVar23 - uVar12;
      return (void *)((long)pvVar21 + (ulong)uVar12);
    }
    if (*(char *)(*(long *)((long)pvVar20 + 0x28) + 0x5c) == '\0') {
      *(undefined8 *)((long)pvVar20 + 0x110) = 0;
      *(undefined4 *)((long)pvVar20 + 0x118) = 0;
      *(undefined8 *)((long)pvVar20 + 0x138) = 0;
      *(undefined4 *)((long)pvVar20 + 0x130) = 0;
      *(undefined8 *)((long)pvVar20 + 0x120) = 0;
      *(undefined8 *)((long)pvVar20 + 0x128) = 0;
      if (*(char *)((long)pvVar20 + 0x180) == '\0') {
        iVar19 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar20 + 0x110),-0xf,"1.2.3",0x70);
      }
      else {
        iVar19 = cm_zlib_inflateReset((z_streamp)((long)pvVar20 + 0x110));
      }
      if (iVar19 != 0) {
        pcVar22 = "Can\'t initialize deflate decompression.";
LAB_003d640a:
        iVar19 = -1;
        goto LAB_003d6415;
      }
      *(undefined1 *)((long)pvVar20 + 0x180) = 1;
      *(undefined1 *)(*(long *)((long)pvVar20 + 0x28) + 0x5c) = 1;
    }
    uVar41 = (uint)(*(short *)(lVar36 + 6) == *(short *)(lVar36 + 4)) * 2;
    strm_00 = (z_streamp)((long)pvVar20 + 0x110);
    *(ulong *)((long)pvVar20 + 0x138) = uVar23;
    bVar9 = false;
    while( true ) {
      uVar12 = *(ushort *)(lVar36 + 8);
      if ((bVar9) || (uVar12 <= uVar23)) break;
      *(ulong *)((long)pvVar20 + 0x128) = *(long *)((long)pvVar20 + 0xa0) + uVar23;
      *(uint *)((long)pvVar20 + 0x130) = (uint)uVar12 - (int)uVar23;
      pcVar22 = (char *)__archive_read_ahead(a,1,&bytes_avail);
      if (bytes_avail < 1) goto LAB_003d606f;
      if ((ulong)*(ushort *)(lVar36 + 6) < (ulong)bytes_avail) {
        bytes_avail = (ulong)*(ushort *)(lVar36 + 6);
      }
      *(char **)((long)pvVar20 + 0x110) = pcVar22;
      *(int *)((long)pvVar20 + 0x118) = (int)bytes_avail;
      *(undefined8 *)((long)pvVar20 + 0x120) = 0;
      if ((int)uVar41 < 1) {
LAB_003d4dda:
        bVar9 = false;
        uVar14 = cm_zlib_inflate(strm_00,0);
        if (uVar14 != 0) {
          if (uVar14 != 1) goto LAB_003d63c9;
          bVar9 = true;
        }
        iVar24 = *(int64_t *)((long)pvVar20 + 0x120);
        *(int64_t *)(lVar36 + 0x10) = iVar24;
        *(char **)(lVar36 + 0x38) = pcVar22;
        iVar24 = cab_minimum_consume_cfdata(a,iVar24);
        if (iVar24 < 0) goto LAB_003d6074;
      }
      else {
        uVar23 = (ulong)uVar41;
        if (uVar23 < (ulong)bytes_avail) {
          if (((uVar41 != 1) && (*pcVar22 == 'C')) && (pcVar22[1] == 'K')) {
            *(char **)((long)pvVar20 + 0x110) = pcVar22 + uVar23;
            *(uint *)((long)pvVar20 + 0x118) = (int)bytes_avail - uVar41;
            *(ulong *)((long)pvVar20 + 0x120) = uVar23;
            uVar41 = 0;
            goto LAB_003d4dda;
          }
LAB_003d6222:
          pcVar22 = "CFDATA incorrect(no MSZIP signature)";
          goto LAB_003d640a;
        }
        cVar43 = *pcVar22;
        if (uVar41 == 2) {
          if (cVar43 != 'C') goto LAB_003d6222;
          if (1 < (ulong)bytes_avail) {
            cVar43 = pcVar22[1];
            goto joined_r0x003d4e38;
          }
        }
        else {
joined_r0x003d4e38:
          if (cVar43 != 'K') goto LAB_003d6222;
        }
        *(ssize_t *)(lVar36 + 0x10) = bytes_avail;
        *(char **)(lVar36 + 0x38) = pcVar22;
        iVar24 = cab_minimum_consume_cfdata(a,bytes_avail);
        if (iVar24 < 0) goto LAB_003d6074;
        uVar41 = uVar41 - (int)bytes_avail;
        bVar9 = false;
      }
      uVar23 = *(ulong *)((long)pvVar20 + 0x138);
    }
    uVar32 = uVar23 & 0xffff;
    if ((uint)uVar32 < (uint)uVar12) {
      archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar32);
      goto LAB_003d641c;
    }
    if ((ulong)*(ushort *)(lVar36 + 6) != 0) {
      pvVar21 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar36 + 6),&bytes_avail);
      if (bytes_avail < 1) goto LAB_003d606f;
      *(ulong *)(lVar36 + 0x10) = (ulong)*(ushort *)(lVar36 + 6);
      *(void **)(lVar36 + 0x38) = pvVar21;
      iVar24 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar36 + 6));
      if (iVar24 < 0) goto LAB_003d6074;
    }
    if (((int)(uint)*(ushort *)(*(long *)((long)pvVar20 + 0x28) + 4) <=
         *(int *)(*(long *)((long)pvVar20 + 0x28) + 0x58)) ||
       ((uVar14 = cm_zlib_inflateReset(strm_00), uVar14 == 0 &&
        (uVar14 = cm_zlib_inflateSetDictionary
                            (strm_00,*(Bytef **)((long)pvVar20 + 0xa0),(uint)*(ushort *)(lVar36 + 8)
                            ), uVar14 == 0)))) {
      uVar12 = *(ushort *)(lVar36 + 0xe);
      lVar31 = *(long *)((long)pvVar20 + 0xa0);
      *avail = uVar32 - uVar12;
      *(short *)(lVar36 + 0xc) = (short)uVar23;
      return (void *)((ulong)uVar12 + lVar31);
    }
LAB_003d63c9:
    if (uVar14 == 0xfffffffc) {
      archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
    }
    else {
      archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)",(ulong)uVar14);
    }
  }
  else {
    if (sVar3 != 0) {
      archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                        *(undefined8 *)(lVar36 + 0x10));
      *avail = -0x19;
      return (void *)0x0;
    }
    lVar36 = *(long *)((long)a->format->data + 0x38);
    pvVar20 = __archive_read_ahead(a,1,avail);
    uVar23 = *avail;
    if (0 < (long)uVar23) {
      uVar32 = (ulong)*(ushort *)(lVar36 + 10);
      if (uVar32 < uVar23) {
        *avail = uVar32;
        uVar23 = uVar32;
      }
      *(undefined2 *)(lVar36 + 0xc) = *(undefined2 *)(lVar36 + 8);
      *(ulong *)(lVar36 + 0x10) = uVar23;
      *(void **)(lVar36 + 0x38) = pvVar20;
      return pvVar20;
    }
LAB_003d606f:
    truncated_error(a);
  }
LAB_003d6074:
  *avail = -0x1e;
  return (void *)0x0;
switchD_003d4fde_caseD_a:
  if (((piVar7[0x1c] < piVar7[0x1e] * 3) && (wVar13 = lzx_br_fillup(strm,br), wVar13 == L'\0')) &&
     (piVar7[0x1c] < piVar7[0x1e] * 3)) {
    *piVar7 = 10;
    goto LAB_003d5f7e;
  }
  piVar7[0x2b] = 0;
  piVar7[0x2c] = 0;
  piVar7[0x2d] = 0;
  piVar7[0x2e] = 0;
  piVar7[0x27] = 0;
  piVar7[0x28] = 0;
  piVar7[0x29] = 0;
  piVar7[0x2a] = 0;
  piVar7[0x23] = 0;
  piVar7[0x24] = 0;
  piVar7[0x25] = 0;
  piVar7[0x26] = 0;
  piVar7[0x1f] = 0;
  piVar7[0x20] = 0;
  piVar7[0x21] = 0;
  piVar7[0x22] = 0;
  piVar7[0x2f] = 0;
  for (lVar31 = 0; lVar31 < ((huffman *)(piVar7 + 0x1e))->len_size; lVar31 = lVar31 + 1) {
    *(byte *)(*(long *)(piVar7 + 0x30) + lVar31) =
         (byte)(*(ulong *)(piVar7 + 0x1a) >> ((char)piVar7[0x1c] - 3U & 0x3f)) & 7;
    piVar7[(ulong)*(byte *)(*(long *)(piVar7 + 0x30) + lVar31) + 0x1f] =
         piVar7[(ulong)*(byte *)(*(long *)(piVar7 + 0x30) + lVar31) + 0x1f] + 1;
    piVar7[0x1c] = piVar7[0x1c] + -3;
  }
  wVar13 = lzx_make_huffman_table((huffman *)(piVar7 + 0x1e));
  if (wVar13 == L'\0') goto LAB_003d5f85;
switchD_003d4fde_caseD_b:
  piVar7[0x96] = 0;
switchD_003d4fde_caseD_c:
  wVar13 = lzx_read_pre_tree(strm);
  if (wVar13 == L'\0') {
    *piVar7 = 0xc;
    goto LAB_003d5f7e;
  }
  wVar13 = lzx_make_huffman_table((huffman *)(piVar7 + 0x78));
  if (wVar13 == L'\0') goto LAB_003d5f85;
  piVar7[0x96] = 0;
switchD_003d4fde_caseD_d:
  wVar13 = lzx_read_bitlen(strm,(huffman *)(piVar7 + 0x5a),L'Ā');
  if (wVar13 < L'\0') goto LAB_003d5f85;
  if (wVar13 == L'\0') {
    *piVar7 = 0xd;
    goto LAB_003d5f7e;
  }
  piVar7[0x96] = 0;
switchD_003d4fde_caseD_e:
  wVar13 = lzx_read_pre_tree(strm);
  if (wVar13 == L'\0') {
    *piVar7 = 0xe;
    goto LAB_003d5f7e;
  }
  wVar13 = lzx_make_huffman_table((huffman *)(piVar7 + 0x78));
  if (wVar13 == L'\0') goto LAB_003d5f85;
  piVar7[0x96] = 0x100;
switchD_003d4fde_caseD_f:
  wVar13 = lzx_read_bitlen(strm,(huffman *)(piVar7 + 0x5a),L'\xffffffff');
  if (wVar13 < L'\0') goto LAB_003d5f85;
  if (wVar13 == L'\0') {
    *piVar7 = 0xf;
    goto LAB_003d5f7e;
  }
  wVar13 = lzx_make_huffman_table((huffman *)(piVar7 + 0x5a));
  if (wVar13 == L'\0') goto LAB_003d5f85;
  piVar7[0x96] = 0;
switchD_003d4fde_caseD_10:
  wVar13 = lzx_read_pre_tree(strm);
  if (wVar13 == L'\0') {
    *piVar7 = 0x10;
    goto LAB_003d5f7e;
  }
  wVar13 = lzx_make_huffman_table((huffman *)(piVar7 + 0x78));
  if (wVar13 == L'\0') goto LAB_003d5f85;
  piVar7[0x96] = 0;
switchD_003d4fde_caseD_11:
  wVar13 = lzx_read_bitlen(strm,(huffman *)(piVar7 + 0x3c),L'\xffffffff');
  if (wVar13 < L'\0') goto LAB_003d5f85;
  if (wVar13 == L'\0') {
    *piVar7 = 0x11;
    goto LAB_003d5f7e;
  }
  wVar13 = lzx_make_huffman_table((huffman *)(piVar7 + 0x3c));
  if (wVar13 == L'\0') goto LAB_003d5f85;
  *piVar7 = 0x12;
  goto LAB_003d4fb0;
  while (iVar19 != 8) {
switchD_003d4fde_caseD_5:
    iVar19 = piVar7[0x1c];
    if (iVar19 < 0x20) {
      if (iVar19 < 0x10) {
        iVar19 = piVar7[0x14];
        if (3 < iVar19) goto LAB_003d5c53;
      }
      else {
        uVar32 = *(ulong *)(piVar7 + 0x1a) >> ((byte)(iVar19 + -0x10) & 0x3f);
        piVar7[0x1c] = iVar19 + -0x10;
        *(char *)(piVar7 + 0x13) = (char)uVar32;
        *(char *)((long)piVar7 + 0x4d) = (char)(uVar32 >> 8);
        piVar7[0x14] = 2;
        iVar19 = 2;
      }
      if (*(char *)((long)piVar7 + 0x75) != '\0') {
        piVar7[0x14] = iVar19 + 1;
        *(char *)((long)piVar7 + (long)iVar19 + 0x4c) = (char)piVar7[0x1d];
        *(undefined1 *)((long)piVar7 + 0x75) = 0;
      }
    }
    else {
      uVar32 = *(ulong *)(piVar7 + 0x1a) >> ((char)iVar19 - 0x10U & 0x3f);
      *(char *)(piVar7 + 0x13) = (char)uVar32;
      *(char *)((long)piVar7 + 0x4d) = (char)(uVar32 >> 8);
      uVar32 = *(ulong *)(piVar7 + 0x1a) >> ((byte)(iVar19 + -0x20) & 0x3f);
      piVar7[0x1c] = iVar19 + -0x20;
      *(char *)((long)piVar7 + 0x4e) = (char)uVar32;
      *(char *)((long)piVar7 + 0x4f) = (char)(uVar32 >> 8);
      piVar7[0x14] = 4;
      lVar36 = local_98;
    }
LAB_003d5c53:
    while( true ) {
      iVar19 = piVar7[0x14];
      if (3 < (long)iVar19) break;
      if (*(long *)((long)pvVar20 + 400) < 1) goto LAB_003d5f7e;
      puVar1 = *(undefined1 **)((long)pvVar20 + 0x188);
      *(undefined1 **)((long)pvVar20 + 0x188) = puVar1 + 1;
      uVar2 = *puVar1;
      piVar7[0x14] = iVar19 + 1;
      *(undefined1 *)((long)piVar7 + (long)iVar19 + 0x4c) = uVar2;
      *(long *)((long)pvVar20 + 400) = *(long *)((long)pvVar20 + 400) + -1;
    }
    piVar7[0x14] = 0;
    iVar19 = *piVar7;
    if (iVar19 == 5) {
      iVar34 = piVar7[0x13];
      piVar7[0x10] = iVar34;
      iVar19 = 6;
LAB_003d5cbf:
      if (iVar34 < 0) goto LAB_003d5f85;
      *piVar7 = iVar19;
    }
    else {
      if (iVar19 == 6) {
        iVar34 = piVar7[0x13];
        piVar7[0x11] = iVar34;
        iVar19 = 7;
        goto LAB_003d5cbf;
      }
      if (iVar19 == 7) {
        piVar7[0x12] = piVar7[0x13];
        if (piVar7[0x13] < 0) goto LAB_003d5f85;
        *piVar7 = 8;
        break;
      }
    }
  }
switchD_003d4fde_caseD_8:
  lVar31 = *(long *)(piVar7 + 0xe);
  while (lVar31 != 0) {
    uVar32 = *(ulong *)((long)pvVar20 + 0x1a8);
    uVar41 = 0;
    if ((long)uVar32 < 1) goto LAB_003d5f96;
    uVar37 = *(ulong *)((long)pvVar20 + 400);
    if ((long)uVar37 < 1) {
      uVar41 = 0;
      if (sVar11 == uVar23) goto LAB_003d5f85;
      goto LAB_003d5f96;
    }
    uVar41 = piVar7[1] - piVar7[6];
    if ((int)(uint)lVar31 <= piVar7[1] - piVar7[6]) {
      uVar41 = (uint)lVar31;
    }
    if ((long)(int)uVar41 <= (long)uVar32) {
      uVar32 = (ulong)uVar41;
    }
    if ((long)(int)uVar32 <= (long)uVar37) {
      uVar37 = uVar32 & 0xffffffff;
    }
    __n = (size_t)(int)uVar37;
    memcpy(*(void **)((long)pvVar20 + 0x1a0),*(void **)((long)pvVar20 + 0x188),__n);
    memcpy((void *)((long)piVar7[6] + *(long *)(piVar7 + 4)),*(void **)((long)pvVar20 + 0x188),__n);
    *(long *)((long)pvVar20 + 0x188) = *(long *)((long)pvVar20 + 0x188) + __n;
    *(long *)((long)pvVar20 + 400) = *(long *)((long)pvVar20 + 400) - __n;
    *(long *)((long)pvVar20 + 0x1a0) = *(long *)((long)pvVar20 + 0x1a0) + __n;
    *(long *)((long)pvVar20 + 0x1a8) = *(long *)((long)pvVar20 + 0x1a8) - __n;
    *(long *)((long)pvVar20 + 0x1b0) = *(long *)((long)pvVar20 + 0x1b0) + __n;
    piVar7[6] = piVar7[6] + (int)uVar37 & piVar7[2];
    lVar31 = *(long *)(piVar7 + 0xe) - __n;
    *(long *)(piVar7 + 0xe) = lVar31;
  }
switchD_003d4fde_caseD_9:
  if ((*(byte *)(piVar7 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar20 + 400) < 1) {
      *piVar7 = 9;
LAB_003d5f7e:
      if (sVar11 == uVar23) {
LAB_003d5f85:
        piVar7[0x97] = -0x19;
        uVar41 = 0xffffffe7;
      }
      else {
        uVar41 = 0;
      }
      goto LAB_003d5f96;
    }
    *(long *)((long)pvVar20 + 0x188) = *(long *)((long)pvVar20 + 0x188) + 1;
    *(long *)((long)pvVar20 + 400) = *(long *)((long)pvVar20 + 400) + -1;
  }
  *piVar7 = 2;
  uVar41 = 1;
  goto LAB_003d5f96;
LAB_003d5609:
  uVar15 = wVar17 & 7;
  local_184 = (uint)(wVar17 + L'\xffffff00') >> 3;
  local_130 = local_130 - lVar35;
  puVar38 = __dest + lVar35;
LAB_003d5621:
  if (uVar15 == 7) {
    wVar42 = (wchar_t)sStack_f0;
    if ((wchar_t)sStack_f0 < (wchar_t)local_a0) {
      wVar17 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      wVar42 = (wchar_t)sStack_f0;
      if ((wVar17 != L'\0') || ((wchar_t)local_a0 <= (wchar_t)sStack_f0)) goto LAB_003d56e5;
      if (sVar11 != uVar23) {
        uVar15 = 7;
        uVar28 = 0x13;
        goto LAB_003d5e03;
      }
      wVar17 = lzx_decode_huffman(local_68,(uint)(bytes_avail <<
                                                 ((char)local_a0 - (char)sStack_f0 & 0x3fU)) &
                                           cache_masks[local_a0]);
      iVar19 = wVar42 - (uint)*(byte *)(local_70 + (ulong)(uint)wVar17);
      sStack_f0 = CONCAT44(sStack_f0._4_4_,iVar19);
      if (iVar19 < 0) goto LAB_003d6021;
    }
    else {
LAB_003d56e5:
      wVar17 = lzx_decode_huffman(local_68,(uint)((ulong)bytes_avail >>
                                                 ((char)wVar42 - (char)local_a0 & 0x3fU)) &
                                           cache_masks[local_a0]);
      sStack_f0 = CONCAT44(sStack_f0._4_4_,wVar42 - (uint)*(byte *)(local_70 + (ulong)(uint)wVar17))
      ;
    }
    local_180 = wVar17 + L'\t';
  }
  else {
    local_180 = uVar15 + 2;
  }
  if (local_130 < (ulong)(long)(int)local_180) goto LAB_003d6021;
  __dest = puVar38;
  uVar41 = local_194;
  uVar8 = 0x15;
  if (local_184 == 0) goto switchD_003d549b_default;
  if (local_184 == 2) {
    local_184 = 2;
    uVar41 = local_15c;
    uVar8 = 0x15;
    uVar29 = local_194;
    local_194 = local_15c;
    goto switchD_003d549b_default;
  }
  if (local_184 == 1) {
    local_184 = 1;
    uVar41 = local_16c;
    uVar8 = 0x15;
    uVar10 = local_194;
    local_194 = local_16c;
    goto switchD_003d549b_default;
  }
  wVar16 = *(wchar_t *)(local_78 + 4 + (long)(int)local_184 * 8);
LAB_003d57bb:
  if ((cVar43 == '\x02') && (L'\x02' < wVar16)) {
    wVar42 = wVar16 + L'\xfffffffd';
    if ((wchar_t)sStack_f0 < wVar42) {
      wVar17 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar17 == L'\0') && ((wchar_t)sStack_f0 < wVar42)) {
LAB_003d6009:
        uVar28 = 0x14;
        if (sVar11 == uVar23) goto LAB_003d6021;
        goto LAB_003d5e03;
      }
    }
    iVar19 = (wchar_t)sStack_f0 - wVar42;
    uVar39 = ((uint)((ulong)bytes_avail >> ((byte)iVar19 & 0x3f)) & cache_masks[(uint)wVar42]) * 8;
    wVar17 = (int)local_b0 + wVar42;
    if ((wchar_t)sStack_f0 < wVar17) {
      wVar18 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar18 != L'\0') || (wVar17 <= (wchar_t)sStack_f0)) {
        iVar19 = (wchar_t)sStack_f0 - wVar42;
        goto LAB_003d59bc;
      }
      if (sVar11 != uVar23) {
        uVar28 = 0x14;
        goto LAB_003d5e03;
      }
      iVar19 = (wchar_t)sStack_f0 - wVar42;
      wVar42 = lzx_decode_huffman(local_80,(uint)(bytes_avail <<
                                                 ((char)local_b0 - (char)iVar19 & 0x3fU)) &
                                           cache_masks[local_b0]);
      iVar19 = iVar19 - (uint)*(byte *)(local_88 + (ulong)(uint)wVar42);
      sStack_f0 = CONCAT44(sStack_f0._4_4_,iVar19);
      if (iVar19 < 0) goto LAB_003d6021;
    }
    else {
LAB_003d59bc:
      wVar42 = lzx_decode_huffman(local_80,(uint)((ulong)bytes_avail >>
                                                 ((char)iVar19 - (char)local_b0 & 0x3fU)) &
                                           cache_masks[local_b0]);
      sStack_f0 = CONCAT44(sStack_f0._4_4_,iVar19 - (uint)*(byte *)(local_88 + (ulong)(uint)wVar42))
      ;
    }
    uVar39 = wVar42 + uVar39;
  }
  else {
    if ((wchar_t)sStack_f0 < wVar16) {
      wVar42 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar42 == L'\0') && ((wchar_t)sStack_f0 < wVar16)) goto LAB_003d6009;
    }
    uVar39 = (uint)((ulong)bytes_avail >> ((byte)((wchar_t)sStack_f0 - wVar16) & 0x3f)) &
             cache_masks[wVar16];
    sStack_f0 = CONCAT44(sStack_f0._4_4_,(wchar_t)sStack_f0 - wVar16);
  }
  uVar41 = (uVar39 + *(int *)(local_78 + (long)(int)local_184 * 8)) - 2;
  local_15c = local_16c;
  __dest = puVar38;
  uVar39 = uVar41;
  local_16c = local_194;
LAB_003d5a32:
  uVar39 = uVar14 - uVar39 & uVar4;
  local_194 = uVar41;
LAB_003d5a45:
  do {
    uVar41 = uVar14;
    if ((int)uVar14 < (int)uVar39) {
      uVar41 = uVar39;
    }
    uVar29 = local_8c - uVar41;
    if ((int)local_180 < (int)(local_8c - uVar41)) {
      uVar29 = local_180;
    }
    if (puVar1 <= __dest + (int)uVar29) {
      uVar29 = (int)puVar1 - (int)__dest;
    }
    pvVar21 = (void *)((int)uVar39 + lVar31);
    if (((int)uVar29 < 8) ||
       (((int)uVar14 <= (int)(uVar39 + uVar29) && ((int)uVar39 <= (int)(uVar14 + uVar29))))) {
      uVar32 = 0;
      if (0 < (int)uVar29) {
        uVar32 = (ulong)uVar29;
      }
      for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
        uVar2 = *(undefined1 *)((long)pvVar21 + uVar37);
        *(undefined1 *)((int)uVar14 + lVar31 + uVar37) = uVar2;
        __dest[uVar37] = uVar2;
      }
    }
    else {
      memcpy((void *)((int)uVar14 + lVar31),pvVar21,(ulong)uVar29);
      memcpy(__dest,pvVar21,(ulong)uVar29);
    }
    puVar38 = __dest + (int)uVar29;
    uVar39 = uVar39 + uVar29 & uVar4;
    uVar14 = uVar14 + uVar29 & uVar4;
    local_130 = local_130 - (long)(int)uVar29;
    uVar8 = 0x16;
    if (puVar38 < puVar1) {
      uVar8 = uVar28;
    }
    iVar19 = 7;
    if (puVar38 < puVar1) {
      iVar19 = 0;
    }
    uVar10 = uVar29;
    if ((int)local_180 <= (int)uVar29) {
      uVar8 = uVar28;
      uVar10 = 0;
    }
    uVar28 = uVar8;
    uVar41 = 10;
    if ((int)local_180 <= (int)uVar29) {
      iVar19 = 10;
    }
    local_180 = local_180 - uVar10;
    __dest = puVar38;
  } while (iVar19 == 0);
  if (iVar19 != 7) {
    if (iVar19 != 10) goto LAB_003d6036;
    uVar41 = uVar39;
    uVar8 = 0x12;
    uVar29 = local_15c;
    uVar10 = local_16c;
    goto switchD_003d549b_default;
  }
LAB_003d5e03:
  *local_60 = bytes_avail;
  local_60[1] = sStack_f0;
  *(ulong *)(local_a8 + 0xe) = local_130;
  local_a8[8] = local_180;
  local_a8[7] = uVar39;
  local_a8[0x15] = uVar15;
  local_a8[0x17] = wVar16;
  local_a8[0x16] = local_184;
  local_a8[0x10] = local_194;
  local_a8[0x11] = local_16c;
  local_a8[0x12] = local_15c;
  *local_a8 = uVar28;
  local_a8[6] = uVar14;
  *(long *)((long)pvVar20 + 0x1a8) = (long)puVar1 - (long)puVar38;
  uVar41 = 0;
  goto LAB_003d6036;
LAB_003d6021:
  local_a8[0x97] = 0xffffffe7;
  uVar41 = 0xffffffe7;
LAB_003d6036:
  lVar31 = local_38 - *(long *)((long)pvVar20 + 0x1a8);
  *(long *)((long)pvVar20 + 0x1a0) = *(long *)((long)pvVar20 + 0x1a0) + lVar31;
  *(long *)((long)pvVar20 + 0x1b0) = *(long *)((long)pvVar20 + 0x1b0) + lVar31;
LAB_003d5f96:
  iVar24 = (sVar11 - *(long *)((long)pvVar20 + 400)) + *(long *)((long)pvVar20 + 0x198);
  *(int64_t *)((long)pvVar20 + 0x198) = iVar24;
  pbVar25 = local_48;
LAB_003d5fb8:
  if (1 < uVar41) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_003d6329;
  }
  *(int64_t *)(lVar36 + 0x10) = iVar24;
  *(byte **)(lVar36 + 0x38) = pbVar25;
  iVar24 = cab_minimum_consume_cfdata(a,iVar24);
  if (iVar24 < 0) goto LAB_003d6329;
  uVar23 = *(ulong *)((long)pvVar20 + 0x1b0);
  goto LAB_003d4eb2;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}